

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall
crnlib::symbol_codec::encode(symbol_codec *this,uint sym,adaptive_arith_data_model *model)

{
  uint bit_00;
  adaptive_bit_model *model_00;
  uint local_28;
  uint bit;
  uint bitmask;
  uint node;
  adaptive_arith_data_model *model_local;
  uint sym_local;
  symbol_codec *this_local;
  
  bit = 1;
  local_28 = model->m_total_syms;
  do {
    local_28 = local_28 >> 1;
    bit_00 = (uint)((sym & local_28) != 0);
    model_00 = vector<crnlib::adaptive_bit_model>::operator[](&model->m_probs,bit);
    encode(this,bit_00,model_00,true);
    bit = bit * 2 + bit_00;
  } while (1 < local_28);
  return;
}

Assistant:

void symbol_codec::encode(uint sym, adaptive_arith_data_model& model)
    {
        uint node = 1;

        uint bitmask = model.m_total_syms;

        do
        {
            bitmask >>= 1;

            uint bit = (sym & bitmask) ? 1 : 0;
            encode(bit, model.m_probs[node]);
            node = (node << 1) + bit;

        } while (bitmask > 1);
    }